

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dce.cpp
# Opt level: O1

void __thiscall
spvtools::opt::VectorDCE::MarkExtractUseAsLive
          (VectorDCE *this,Instruction *current_inst,BitVector *live_elements,
          LiveComponentMap *live_components,
          vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
          *work_list)

{
  IRContext *this_00;
  DefUseManager *this_01;
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  Instruction *inst;
  uint uVar4;
  VectorDCE *this_02;
  WorkListItem new_item;
  BitVector BStack_70;
  undefined1 local_50 [24];
  pointer local_38;
  
  this_00 = (this->super_MemPass).super_Pass.context_;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  this_01 = (this_00->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  uVar2 = (current_inst->has_result_id_ & 1) + 1;
  if (current_inst->has_type_id_ == false) {
    uVar2 = (uint)current_inst->has_result_id_;
  }
  uVar2 = Instruction::GetSingleWordOperand(current_inst,uVar2);
  inst = analysis::DefUseManager::GetDef(this_01,uVar2);
  bVar1 = HasScalarResult(this,inst);
  if ((!bVar1) && (bVar1 = HasVectorResult(this,inst), !bVar1)) {
    return;
  }
  BStack_70.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  BStack_70.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BStack_70.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  BStack_70.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(8);
  BStack_70.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       BStack_70.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  *BStack_70.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  uVar4 = (current_inst->has_result_id_ & 1) + 1;
  if (current_inst->has_type_id_ == false) {
    uVar4 = (uint)current_inst->has_result_id_;
  }
  BStack_70.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       BStack_70.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((int)((ulong)((long)(current_inst->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(current_inst->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 - uVar4 < 2)
  {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&BStack_70.bits_,&live_elements->bits_);
  }
  else {
    uVar2 = Instruction::GetSingleWordOperand(current_inst,uVar4 + 1);
    uVar3 = 0;
    if (inst->has_type_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(inst,0);
    }
    uVar3 = GetVectorComponentCount(this,uVar3);
    if (uVar2 < uVar3) {
      utils::BitVector::Set(&BStack_70,uVar2);
    }
  }
  this_02 = (VectorDCE *)(local_50 + 8);
  local_50._0_8_ = inst;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_02,&BStack_70.bits_);
  AddItemToWorkListIfNeeded(this_02,(WorkListItem *)local_50,live_components,work_list);
  if ((pointer)local_50._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_50._8_8_,(long)local_38 - local_50._8_8_);
  }
  if (BStack_70.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(BStack_70.bits_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)BStack_70.bits_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)BStack_70.bits_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void VectorDCE::MarkExtractUseAsLive(const Instruction* current_inst,
                                     const utils::BitVector& live_elements,
                                     LiveComponentMap* live_components,
                                     std::vector<WorkListItem>* work_list) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  uint32_t operand_id =
      current_inst->GetSingleWordInOperand(kExtractCompositeIdInIdx);
  Instruction* operand_inst = def_use_mgr->GetDef(operand_id);

  if (HasVectorOrScalarResult(operand_inst)) {
    WorkListItem new_item;
    new_item.instruction = operand_inst;
    if (current_inst->NumInOperands() < 2) {
      new_item.components = live_elements;
    } else {
      uint32_t element_index = current_inst->GetSingleWordInOperand(1);
      uint32_t item_size = GetVectorComponentCount(operand_inst->type_id());
      if (element_index < item_size) {
        new_item.components.Set(element_index);
      }
    }
    AddItemToWorkListIfNeeded(new_item, live_components, work_list);
  }
}